

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMem.c
# Opt level: O0

void Ivy_ManStopMemory(Ivy_Man_t *p)

{
  int iVar1;
  void *__ptr;
  int local_1c;
  int i;
  void *pMemory;
  Ivy_Man_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vChunks), local_1c < iVar1; local_1c = local_1c + 1) {
    __ptr = Vec_PtrEntry(p->vChunks,local_1c);
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  Vec_PtrFree(p->vChunks);
  Vec_PtrFree(p->vPages);
  p->pListFree = (Ivy_Obj_t *)0x0;
  return;
}

Assistant:

void Ivy_ManStopMemory( Ivy_Man_t * p )
{
    void * pMemory;
    int i;
    Vec_PtrForEachEntry( void *, p->vChunks, pMemory, i )
        ABC_FREE( pMemory );
    Vec_PtrFree( p->vChunks );
    Vec_PtrFree( p->vPages );
    p->pListFree = NULL;
}